

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftstream.c
# Opt level: O0

FT_UInt32 FT_Stream_ReadULong(FT_Stream stream,FT_Error *error)

{
  unsigned_long uVar1;
  uint local_34;
  byte *pbStack_30;
  FT_UInt32 result;
  FT_Byte *p;
  FT_Error *pFStack_20;
  FT_Byte reads [4];
  FT_Error *error_local;
  FT_Stream stream_local;
  
  local_34 = 0;
  pFStack_20 = error;
  if (stream->pos + 3 < stream->size) {
    if (stream->read == (FT_Stream_IoFunc)0x0) {
      pbStack_30 = stream->base + stream->pos;
    }
    else {
      uVar1 = (*stream->read)(stream,stream->pos,(uchar *)((long)&p + 4),4);
      if (uVar1 != 4) goto LAB_002e0b43;
      pbStack_30 = (byte *)((long)&p + 4);
    }
    if (pbStack_30 != (byte *)0x0) {
      local_34 = (uint)*pbStack_30 << 0x18 | (uint)pbStack_30[1] << 0x10 | (uint)pbStack_30[2] << 8
                 | (uint)pbStack_30[3];
    }
    stream->pos = stream->pos + 4;
    *pFStack_20 = 0;
    stream_local._4_4_ = local_34;
  }
  else {
LAB_002e0b43:
    *pFStack_20 = 0x55;
    stream_local._4_4_ = 0;
  }
  return stream_local._4_4_;
}

Assistant:

FT_BASE_DEF( FT_UInt32 )
  FT_Stream_ReadULong( FT_Stream  stream,
                       FT_Error*  error )
  {
    FT_Byte   reads[4];
    FT_Byte*  p;
    FT_UInt32 result = 0;


    FT_ASSERT( stream );

    if ( stream->pos + 3 < stream->size )
    {
      if ( stream->read )
      {
        if ( stream->read( stream, stream->pos, reads, 4L ) != 4L )
          goto Fail;

        p = reads;
      }
      else
        p = stream->base + stream->pos;

      if ( p )
        result = FT_NEXT_ULONG( p );
    }
    else
      goto Fail;

    stream->pos += 4;

    *error = FT_Err_Ok;

    return result;

  Fail:
    *error = FT_THROW( Invalid_Stream_Operation );
    FT_ERROR(( "FT_Stream_ReadULong:"
               " invalid i/o; pos = 0x%lx, size = 0x%lx\n",
               stream->pos, stream->size ));

    return result;
  }